

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O0

HostInfo * BamTools::Internal::HostInfo::Lookup(string *hostname,string *port)

{
  _Rb_tree_const_iterator<BamTools::Internal::HostAddress> __first;
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  NetworkProtocol NVar4;
  uint32_t __hostlong;
  uint32_t uVar5;
  int iVar6;
  char *pcVar7;
  char *__service;
  HostInfo *in_RDI;
  pair<std::_Rb_tree_const_iterator<BamTools::Internal::HostAddress>,_bool> pVar8;
  HostAddress a_1;
  sockaddr_in6 *ipv6;
  HostAddress a;
  sockaddr_in *ipv4;
  addrinfo *p;
  int status;
  addrinfo *res;
  addrinfo hints;
  char serv [32];
  char hbuf [1025];
  socklen_t saSize;
  sockaddr *sa;
  sockaddr_in6 sa6;
  sockaddr_in sa4;
  uint16_t portNum;
  HostAddress address;
  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  uniqueAddresses;
  HostInfo *result;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  HostInfo *in_stack_fffffffffffff810;
  vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_> *this;
  value_type *in_stack_fffffffffffff828;
  allocator *paVar9;
  HostAddress *in_stack_fffffffffffff830;
  allocator *in_stack_fffffffffffff838;
  undefined7 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff847;
  _Rb_tree_const_iterator<BamTools::Internal::HostAddress> in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  local_731 [2];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [32];
  _Base_ptr local_690;
  undefined1 local_688;
  sockaddr *local_640;
  _Base_ptr local_638;
  undefined1 local_630;
  HostAddress *in_stack_fffffffffffff9f8;
  addrinfo *local_5e0;
  addrinfo *local_5d0;
  addrinfo local_5c8;
  _Base_ptr local_590;
  undefined1 local_588;
  string local_580 [32];
  string local_560 [39];
  allocator local_539;
  string local_538 [32];
  char local_518 [32];
  char local_4f8 [1028];
  undefined1 local_f4 [16];
  socklen_t local_e4;
  sockaddr *local_e0;
  sockaddr local_d8;
  undefined4 uStack_c8;
  undefined8 uStack_c4;
  sockaddr local_b8;
  uint16_t local_a2;
  HostAddress local_a0 [2];
  byte local_19;
  
  local_19 = 0;
  HostInfo(in_stack_fffffffffffff810);
  SetHostName(in_stack_fffffffffffff810,
              (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  std::
  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  ::set((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
         *)0x1d7de3);
  HostAddress::HostAddress((HostAddress *)in_stack_fffffffffffff810);
  HostAddress::SetAddress
            ((HostAddress *)in_stack_fffffffffffff810,
             (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  bVar1 = HostAddress::HasIPAddress(local_a0);
  if (bVar1) {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar6 = atoi(pcVar7);
    local_a2 = (uint16_t)iVar6;
    local_e0 = (sockaddr *)0x0;
    local_e4 = 0;
    NVar4 = HostAddress::GetProtocol(local_a0);
    if (NVar4 == IPv4Protocol) {
      local_e0 = &local_b8;
      local_e4 = 0x10;
      local_b8.sa_data[6] = '\0';
      local_b8.sa_data[7] = '\0';
      local_b8.sa_data[8] = '\0';
      local_b8.sa_data[9] = '\0';
      local_b8.sa_data[10] = '\0';
      local_b8.sa_data[0xb] = '\0';
      local_b8.sa_data[0xc] = '\0';
      local_b8.sa_data[0xd] = '\0';
      local_b8.sa_family = 2;
      local_b8.sa_data[0] = '\0';
      local_b8.sa_data[1] = '\0';
      local_b8.sa_data[2] = '\0';
      local_b8.sa_data[3] = '\0';
      local_b8.sa_data[4] = '\0';
      local_b8.sa_data[5] = '\0';
      __hostlong = HostAddress::GetIPv4Address(local_a0);
      uVar5 = htonl(__hostlong);
      local_b8.sa_data._2_4_ = uVar5;
      uVar3 = htons(local_a2);
      local_b8.sa_data._0_2_ = uVar3;
    }
    else {
      NVar4 = HostAddress::GetProtocol(local_a0);
      if (NVar4 == IPv4Protocol) {
        local_e0 = &local_d8;
        local_e4 = 0x1c;
        uStack_c8 = 0;
        uStack_c4 = 0;
        local_d8.sa_data[6] = '\0';
        local_d8.sa_data[7] = '\0';
        local_d8.sa_data[8] = '\0';
        local_d8.sa_data[9] = '\0';
        local_d8.sa_data[10] = '\0';
        local_d8.sa_data[0xb] = '\0';
        local_d8.sa_data[0xc] = '\0';
        local_d8.sa_data[0xd] = '\0';
        local_d8.sa_family = 10;
        local_d8.sa_data[0] = '\0';
        local_d8.sa_data[1] = '\0';
        local_d8.sa_data[2] = '\0';
        local_d8.sa_data[3] = '\0';
        local_d8.sa_data[4] = '\0';
        local_d8.sa_data[5] = '\0';
        local_f4 = (undefined1  [16])HostAddress::GetIPv6Address(local_a0);
        local_d8.sa_data._10_4_ = local_f4._4_4_;
        local_d8.sa_data._6_4_ = local_f4._0_4_;
        uVar3 = htons(local_a2);
        local_d8.sa_data._0_2_ = uVar3;
      }
      else {
        bamtools_noop();
      }
    }
    if (local_e0 != (sockaddr *)0x0) {
      in_stack_fffffffffffff808 = 0;
      iVar6 = getnameinfo(local_e0,local_e4,local_4f8,0x401,local_518,0x20,0);
      if (iVar6 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_538,local_4f8,&local_539);
        SetHostName(in_stack_fffffffffffff810,
                    (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::__cxx11::string::~string(local_538);
        std::allocator<char>::~allocator((allocator<char> *)&local_539);
      }
    }
    HostName_abi_cxx11_((HostInfo *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_560);
    if ((bVar2 & 1) != 0) {
      HostAddress::GetIPString_abi_cxx11_(in_stack_fffffffffffff9f8);
      SetHostName(in_stack_fffffffffffff810,
                  (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      std::__cxx11::string::~string(local_580);
    }
    pVar8 = std::
            set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
            ::insert((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                      *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    local_590 = (_Base_ptr)pVar8.first._M_node;
    local_588 = pVar8.second;
  }
  else {
    local_5c8.ai_canonname = (char *)0x0;
    local_5c8.ai_next = (addrinfo *)0x0;
    local_5c8.ai_addrlen = 0;
    local_5c8._20_4_ = 0;
    local_5c8.ai_addr = (sockaddr *)0x0;
    local_5c8.ai_flags = 0;
    local_5c8.ai_family = 0;
    local_5c8.ai_socktype = 1;
    local_5c8.ai_protocol = 6;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    __service = (char *)std::__cxx11::string::c_str();
    iVar6 = getaddrinfo(pcVar7,__service,&local_5c8,&local_5d0);
    if (iVar6 == 0) {
      for (local_5e0 = local_5d0; local_5e0 != (addrinfo *)0x0; local_5e0 = local_5e0->ai_next) {
        if (local_5e0->ai_family == 2) {
          ntohl(*(uint32_t *)(local_5e0->ai_addr->sa_data + 2));
          HostAddress::HostAddress
                    (in_stack_fffffffffffff830,(uint32_t)((ulong)in_stack_fffffffffffff828 >> 0x20))
          ;
          pVar8 = std::
                  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                  ::insert((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                            *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
          local_638 = (_Base_ptr)pVar8.first._M_node;
          in_stack_fffffffffffff857 = pVar8.second;
          local_630 = in_stack_fffffffffffff857;
          HostAddress::~HostAddress((HostAddress *)0x1d8360);
        }
        else if (local_5e0->ai_family == 10) {
          local_640 = local_5e0->ai_addr;
          HostAddress::HostAddress(in_stack_fffffffffffff830,(uint8_t *)in_stack_fffffffffffff828);
          pVar8 = std::
                  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                  ::insert((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                            *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
          in_stack_fffffffffffff848 = pVar8.first._M_node;
          in_stack_fffffffffffff847 = pVar8.second;
          local_690 = in_stack_fffffffffffff848._M_node;
          local_688 = in_stack_fffffffffffff847;
          HostAddress::~HostAddress((HostAddress *)0x1d8411);
        }
      }
      bVar1 = std::
              set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
              ::empty((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                       *)0x1d8463);
      if (bVar1) {
        SetError(in_RDI,UnknownError);
        in_stack_fffffffffffff838 = &local_6b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_6b0,"HostInfo: unknown address types found",in_stack_fffffffffffff838);
        SetErrorString(in_stack_fffffffffffff810,
                       (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
      }
    }
    else if (((iVar6 == -2) || (iVar6 == -4)) || (iVar6 == -5)) {
      SetError(in_RDI,HostNotFound);
      paVar9 = &local_6d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6d8,"HostInfo: host not found",paVar9);
      SetErrorString(in_stack_fffffffffffff810,
                     (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      std::__cxx11::string::~string(local_6d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    }
    else {
      SetError(in_RDI,UnknownError);
      paVar9 = &local_701;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_700,"HostInfo: unknown error encountered",paVar9);
      SetErrorString(in_stack_fffffffffffff810,
                     (string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      std::__cxx11::string::~string(local_700);
      std::allocator<char>::~allocator((allocator<char> *)&local_701);
    }
    freeaddrinfo(local_5d0);
  }
  local_731[0].
  super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  ._M_impl.super__Vector_impl_data._9_8_ =
       std::
       set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
       ::begin((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
                *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_731[0].
  super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  ._M_impl.super__Vector_impl_data._1_8_ =
       std::
       set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
       ::end((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
              *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  this = local_731;
  std::allocator<BamTools::Internal::HostAddress>::allocator
            ((allocator<BamTools::Internal::HostAddress> *)0x1d8723);
  __first._M_node._7_1_ = in_stack_fffffffffffff857;
  __first._M_node._0_7_ = in_stack_fffffffffffff850;
  std::vector<BamTools::Internal::HostAddress,std::allocator<BamTools::Internal::HostAddress>>::
  vector<std::_Rb_tree_const_iterator<BamTools::Internal::HostAddress>,void>
            ((vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
              *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),__first,
             in_stack_fffffffffffff848,(allocator_type *)in_stack_fffffffffffff838);
  SetAddresses(in_stack_fffffffffffff810,
               (vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
                *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  ~vector(this);
  std::allocator<BamTools::Internal::HostAddress>::~allocator
            ((allocator<BamTools::Internal::HostAddress> *)0x1d8778);
  local_19 = 1;
  HostAddress::~HostAddress((HostAddress *)0x1d878d);
  std::
  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  ::~set((set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
          *)0x1d879a);
  if ((local_19 & 1) == 0) {
    ~HostInfo(in_stack_fffffffffffff810);
  }
  return in_RDI;
}

Assistant:

HostInfo HostInfo::Lookup(const std::string& hostname, const std::string& port)
{

    HostInfo result;
    result.SetHostName(hostname);
    std::set<HostAddress> uniqueAddresses;

#ifdef _WIN32
    WindowsSockInit init;
#endif

    HostAddress address;
    address.SetAddress(hostname);

    // if hostname is an IP string ('0.0.0.0' or IPv6 format)
    // do reverse lookup for host domain name
    //
    // TODO: might just remove this... not sure if proper 'hostname' from IP string is needed
    //
    //       so far, haven't been able to successfully fetch a domain name with reverse DNS
    //       getnameinfo() on test sites just returns original IP string. BUT this is likely a rare
    //       case that client code tries to use an IP string and the connection should work fine
    //       anyway. GetHostName() just won't quite show what I was hoping for. :(
    if (address.HasIPAddress()) {

        const uint16_t portNum = static_cast<uint16_t>(std::atoi(port.c_str()));

        sockaddr_in sa4;
        sockaddr_in6 sa6;
        sockaddr* sa = 0;
        BT_SOCKLEN_T saSize = 0;

        // IPv4
        if (address.GetProtocol() == HostAddress::IPv4Protocol) {
            sa = (sockaddr*)&sa4;
            saSize = sizeof(sa4);
            std::memset(&sa4, 0, sizeof(sa4));
            sa4.sin_family = AF_INET;
            sa4.sin_addr.s_addr = htonl(address.GetIPv4Address());
            sa4.sin_port = htons(portNum);
        }

        // IPv6
        else if (address.GetProtocol() == HostAddress::IPv4Protocol) {
            sa = (sockaddr*)&sa6;
            saSize = sizeof(sa6);
            std::memset(&sa6, 0, sizeof(sa6));
            sa6.sin6_family = AF_INET6;
            std::memcpy(sa6.sin6_addr.s6_addr, address.GetIPv6Address().data,
                        sizeof(sa6.sin6_addr.s6_addr));
            sa6.sin6_port = htons(portNum);
        }

        // unknown (should be unreachable)
        else {
            BT_ASSERT_X(false, "HostInfo::Lookup: unknown network protocol");
        }

        // lookup name for IP
        char hbuf[NI_MAXHOST];
        char serv[NI_MAXSERV];
        if (sa && (getnameinfo(sa, saSize, hbuf, sizeof(hbuf), serv, sizeof(serv), 0) == 0)) {
            result.SetHostName(std::string(hbuf));
        }

        // if no domain name found, just use the original address's IP string
        if (result.HostName().empty()) {
            result.SetHostName(address.GetIPString());
        }

        // store address in HostInfo
        uniqueAddresses.insert(address);
    }

    // otherwise, hostname is a domain name ('www.foo.bar')
    // do 'normal' lookup
    else {

        // setup address lookup 'hints'
        addrinfo hints;
        std::memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;      // allow either IPv4 or IPv6
        hints.ai_socktype = SOCK_STREAM;  // for TCP
        hints.ai_protocol = IPPROTO_TCP;

        // fetch addresses for requested hostname/port
        addrinfo* res;
        int status = getaddrinfo(hostname.c_str(), port.c_str(), &hints, &res);

        // if everything OK
        if (status == 0) {

            // iterate over all IP addresses found
            addrinfo* p = res;
            for (; p != NULL; p = p->ai_next) {

                // IPv4
                if (p->ai_family == AF_INET) {
                    sockaddr_in* ipv4 = (sockaddr_in*)p->ai_addr;
                    HostAddress a(ntohl(ipv4->sin_addr.s_addr));
                    uniqueAddresses.insert(a);
                }

                // IPv6
                else if (p->ai_family == AF_INET6) {
                    sockaddr_in6* ipv6 = (sockaddr_in6*)p->ai_addr;
                    HostAddress a(ipv6->sin6_addr.s6_addr);
                    uniqueAddresses.insert(a);
                }
            }

            // if we iterated, but no addresses were stored
            if (uniqueAddresses.empty() && (p == NULL)) {
                result.SetError(HostInfo::UnknownError);
                result.SetErrorString("HostInfo: unknown address types found");
            }
        }

        // handle error cases
        else if (
#ifndef _WIN32
            status == EAI_NONAME || status == EAI_FAIL
#ifdef EAI_NODATA
            || status == EAI_NODATA  // officially deprecated, but just in case we happen to hit it
#endif                               // EAI_NODATA

#else   // _WIN32
            WSAGetLastError() == WSAHOST_NOT_FOUND || WSAGetLastError() == WSANO_DATA ||
            WSAGetLastError() == WSANO_RECOVERY
#endif  // _WIN32
        ) {
            result.SetError(HostInfo::HostNotFound);
            result.SetErrorString("HostInfo: host not found");
        } else {
            result.SetError(HostInfo::UnknownError);
            result.SetErrorString("HostInfo: unknown error encountered");
        }